

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O0

void ComputeGNSSPosition(double Latitude,double Longitude,double Altitude,int GNSSquality,int nbSat,
                        double HDOP)

{
  double local_480;
  double local_478;
  interval local_470;
  double local_458;
  double local_450;
  interval local_448;
  double local_430;
  double local_428;
  interval local_420;
  double local_408;
  double local_400;
  interval local_3f8;
  double local_3e0;
  double local_3d8;
  interval local_3d0;
  double local_3b8;
  double local_3b0;
  interval local_3a8;
  double local_390;
  double local_388;
  interval local_380;
  double local_368;
  double local_360;
  interval local_358;
  double local_340;
  double local_338;
  interval local_330;
  double local_318;
  double local_310;
  interval local_308;
  double local_2f0;
  double local_2e8;
  interval local_2e0;
  double local_2c8;
  double local_2c0;
  interval local_2b8;
  double local_2a0;
  double local_298;
  interval local_290;
  double local_278;
  double local_270;
  interval local_268;
  double local_250;
  double local_248;
  interval local_240;
  double local_228;
  double local_220;
  interval local_218;
  double local_200;
  double local_1f8;
  interval local_1f0;
  double local_1d8;
  double local_1d0;
  interval local_1c8;
  double local_1b0;
  double local_1a8;
  interval local_1a0;
  double local_188;
  double local_180;
  interval local_178;
  double local_160;
  double local_158;
  interval local_150;
  double local_138;
  double local_130;
  interval local_128;
  double local_110;
  double local_108;
  interval local_100;
  double local_e8;
  double local_e0;
  interval local_d8;
  double local_c0;
  double local_b8;
  interval local_b0;
  double local_98;
  double local_90;
  interval local_88;
  double local_70;
  double local_68;
  interval local_60;
  double local_48;
  double z;
  double y;
  double x;
  double HDOP_local;
  int nbSat_local;
  int GNSSquality_local;
  double Altitude_local;
  double Longitude_local;
  double Latitude_local;
  
  y = 0.0;
  z = 0.0;
  local_48 = 0.0;
  x = HDOP;
  HDOP_local._0_4_ = nbSat;
  HDOP_local._4_4_ = GNSSquality;
  _nbSat_local = Altitude;
  Altitude_local = Longitude;
  Longitude_local = Latitude;
  GPS2EnvCoordSystem(lat_env,long_env,alt_env,angle_env,Latitude,Longitude,Altitude,&y,&z,&local_48)
  ;
  switch(HDOP_local._4_4_) {
  case 0:
  case 6:
  default:
    local_428 = -10000.0;
    local_430 = 10000.0;
    interval::interval(&local_420,&local_428,&local_430);
    interval::operator=((interval *)&x_gps,&local_420);
    local_450 = -10000.0;
    local_458 = 10000.0;
    interval::interval(&local_448,&local_450,&local_458);
    interval::operator=((interval *)&y_gps,&local_448);
    local_478 = -10000.0;
    local_480 = 10000.0;
    interval::interval(&local_470,&local_478,&local_480);
    interval::operator=((interval *)&z_gps,&local_470);
    break;
  case 1:
  case 2:
    if ((HDOP_local._0_4_ < GPS_high_acc_nbsat) || (GPS_high_acc_HDOP < x)) {
      if (((GPS_med_acc_nbsat <= HDOP_local._0_4_) && (x <= GPS_med_acc_HDOP)) ||
         (HDOP_local._0_4_ < 1)) {
        local_e0 = y - GPS_med_acc;
        local_e8 = y + GPS_med_acc;
        interval::interval(&local_d8,&local_e0,&local_e8);
        interval::operator=((interval *)&x_gps,&local_d8);
        local_108 = z - GPS_med_acc;
        local_110 = z + GPS_med_acc;
        interval::interval(&local_100,&local_108,&local_110);
        interval::operator=((interval *)&y_gps,&local_100);
        local_130 = GPS_med_acc * -5.0 + local_48;
        local_138 = GPS_med_acc * 5.0 + local_48;
        interval::interval(&local_128,&local_130,&local_138);
        interval::operator=((interval *)&z_gps,&local_128);
      }
      else if ((HDOP_local._0_4_ < GPS_low_acc_nbsat) || (GPS_low_acc_HDOP < x)) {
        local_1d0 = y - 10000.0;
        local_1d8 = y + 10000.0;
        interval::interval(&local_1c8,&local_1d0,&local_1d8);
        interval::operator=((interval *)&x_gps,&local_1c8);
        local_1f8 = z - 10000.0;
        local_200 = z + 10000.0;
        interval::interval(&local_1f0,&local_1f8,&local_200);
        interval::operator=((interval *)&y_gps,&local_1f0);
        local_220 = local_48 - 50000.0;
        local_228 = local_48 + 50000.0;
        interval::interval(&local_218,&local_220,&local_228);
        interval::operator=((interval *)&z_gps,&local_218);
      }
      else {
        local_158 = y - GPS_low_acc;
        local_160 = y + GPS_low_acc;
        interval::interval(&local_150,&local_158,&local_160);
        interval::operator=((interval *)&x_gps,&local_150);
        local_180 = z - GPS_low_acc;
        local_188 = z + GPS_low_acc;
        interval::interval(&local_178,&local_180,&local_188);
        interval::operator=((interval *)&y_gps,&local_178);
        local_1a8 = GPS_low_acc * -5.0 + local_48;
        local_1b0 = GPS_low_acc * 5.0 + local_48;
        interval::interval(&local_1a0,&local_1a8,&local_1b0);
        interval::operator=((interval *)&z_gps,&local_1a0);
      }
    }
    else {
      local_68 = y - GPS_high_acc;
      local_70 = y + GPS_high_acc;
      interval::interval(&local_60,&local_68,&local_70);
      interval::operator=((interval *)&x_gps,&local_60);
      local_90 = z - GPS_high_acc;
      local_98 = z + GPS_high_acc;
      interval::interval(&local_88,&local_90,&local_98);
      interval::operator=((interval *)&y_gps,&local_88);
      local_b8 = GPS_high_acc * -5.0 + local_48;
      local_c0 = GPS_high_acc * 5.0 + local_48;
      interval::interval(&local_b0,&local_b8,&local_c0);
      interval::operator=((interval *)&z_gps,&local_b0);
    }
    break;
  case 4:
    if (((HDOP_local._0_4_ < GPS_med_acc_nbsat) && (0 < HDOP_local._0_4_)) || (GPS_med_acc_HDOP < x)
       ) {
      local_338 = y - GPS_low_acc;
      local_340 = y + GPS_low_acc;
      interval::interval(&local_330,&local_338,&local_340);
      interval::operator=((interval *)&x_gps,&local_330);
      local_360 = z - GPS_low_acc;
      local_368 = z + GPS_low_acc;
      interval::interval(&local_358,&local_360,&local_368);
      interval::operator=((interval *)&y_gps,&local_358);
      local_388 = GPS_low_acc * -5.0 + local_48;
      local_390 = GPS_low_acc * 5.0 + local_48;
      interval::interval(&local_380,&local_388,&local_390);
      interval::operator=((interval *)&z_gps,&local_380);
    }
    else {
      local_3b0 = y - RTK_fixed_acc;
      local_3b8 = y + RTK_fixed_acc;
      interval::interval(&local_3a8,&local_3b0,&local_3b8);
      interval::operator=((interval *)&x_gps,&local_3a8);
      local_3d8 = z - RTK_fixed_acc;
      local_3e0 = z + RTK_fixed_acc;
      interval::interval(&local_3d0,&local_3d8,&local_3e0);
      interval::operator=((interval *)&y_gps,&local_3d0);
      local_400 = RTK_fixed_acc * -5.0 + local_48;
      local_408 = RTK_fixed_acc * 5.0 + local_48;
      interval::interval(&local_3f8,&local_400,&local_408);
      interval::operator=((interval *)&z_gps,&local_3f8);
    }
    break;
  case 5:
    if (((HDOP_local._0_4_ < GPS_med_acc_nbsat) && (0 < HDOP_local._0_4_)) || (GPS_med_acc_HDOP < x)
       ) {
      local_248 = y - GPS_low_acc;
      local_250 = y + GPS_low_acc;
      interval::interval(&local_240,&local_248,&local_250);
      interval::operator=((interval *)&x_gps,&local_240);
      local_270 = z - GPS_low_acc;
      local_278 = z + GPS_low_acc;
      interval::interval(&local_268,&local_270,&local_278);
      interval::operator=((interval *)&y_gps,&local_268);
      local_298 = GPS_low_acc * -5.0 + local_48;
      local_2a0 = GPS_low_acc * 5.0 + local_48;
      interval::interval(&local_290,&local_298,&local_2a0);
      interval::operator=((interval *)&z_gps,&local_290);
    }
    else {
      local_2c0 = y - RTK_float_acc;
      local_2c8 = y + RTK_float_acc;
      interval::interval(&local_2b8,&local_2c0,&local_2c8);
      interval::operator=((interval *)&x_gps,&local_2b8);
      local_2e8 = z - RTK_float_acc;
      local_2f0 = z + RTK_float_acc;
      interval::interval(&local_2e0,&local_2e8,&local_2f0);
      interval::operator=((interval *)&y_gps,&local_2e0);
      local_310 = RTK_float_acc * -5.0 + local_48;
      local_318 = RTK_float_acc * 5.0 + local_48;
      interval::interval(&local_308,&local_310,&local_318);
      interval::operator=((interval *)&z_gps,&local_308);
    }
  }
  return;
}

Assistant:

inline void ComputeGNSSPosition(double Latitude, double Longitude, double Altitude, int GNSSquality, int nbSat, double HDOP)
{
	double x = 0, y = 0, z = 0;

	GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, Latitude, Longitude, Altitude, &x, &y, &z);
	switch (GNSSquality)
	{
	case AUTONOMOUS_GNSS_FIX:
	case DIFFERENTIAL_GNSS_FIX:
		if ((nbSat >= GPS_high_acc_nbsat)&&(HDOP <= GPS_high_acc_HDOP))
		{
			x_gps = interval(x-GPS_high_acc, x+GPS_high_acc);
			y_gps = interval(y-GPS_high_acc, y+GPS_high_acc);
			z_gps = interval(z-5.0*GPS_high_acc, z+5.0*GPS_high_acc);
		}
		else if (((nbSat >= GPS_med_acc_nbsat)&&(HDOP <= GPS_med_acc_HDOP))||(nbSat <= 0))
		{
			// Default accuracy...
			x_gps = interval(x-GPS_med_acc, x+GPS_med_acc);
			y_gps = interval(y-GPS_med_acc, y+GPS_med_acc);
			z_gps = interval(z-5.0*GPS_med_acc, z+5.0*GPS_med_acc);
		}
		else if ((nbSat >= GPS_low_acc_nbsat)&&(HDOP <= GPS_low_acc_HDOP))
		{
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-MAX_UNCERTAINTY, x+MAX_UNCERTAINTY);
			y_gps = interval(y-MAX_UNCERTAINTY, y+MAX_UNCERTAINTY);
			z_gps = interval(z-5.0*MAX_UNCERTAINTY, z+5.0*MAX_UNCERTAINTY);
		}
		break;
	case RTK_FLOAT:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_float_acc, x+RTK_float_acc);
			y_gps = interval(y-RTK_float_acc, y+RTK_float_acc);
			z_gps = interval(z-5.0*RTK_float_acc, z+5.0*RTK_float_acc);
		}
		break;
	case RTK_FIXED:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_fixed_acc, x+RTK_fixed_acc);
			y_gps = interval(y-RTK_fixed_acc, y+RTK_fixed_acc);
			z_gps = interval(z-5.0*RTK_fixed_acc, z+5.0*RTK_fixed_acc);
		}
		break;
	case GNSS_NO_FIX:
	case GNSS_ESTIMATED_FIX:
	default:
		x_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		y_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		z_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		break;
	}
}